

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O1

uint prvTidytmbstrcat(tmbstr s1,ctmbstr s2)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  
  do {
    pcVar3 = s1;
    s1 = pcVar3 + 1;
  } while (*pcVar3 != '\0');
  cVar1 = *s2;
  *pcVar3 = cVar1;
  if (cVar1 != '\0') {
    lVar2 = 0;
    do {
      cVar1 = s2[lVar2 + 1];
      (pcVar3 + 1)[lVar2] = cVar1;
      lVar2 = lVar2 + 1;
    } while (cVar1 != '\0');
    return (uint)lVar2;
  }
  return 0;
}

Assistant:

uint TY_(tmbstrcat)( tmbstr s1, ctmbstr s2 )
{
    uint ncpy = 0;
    while ( *s1 )
        ++s1;

    while (0 != (*s1++ = *s2++) )
        ++ncpy;
    return ncpy;
}